

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall
google::LogMessage::LogMessage(LogMessage *this,char *file,int line,CheckOpString *result)

{
  ostream *poVar1;
  LogStream *pLVar2;
  
  this->allocated_ = (LogMessageData *)0x0;
  LogMessageTime::LogMessageTime(&this->time_);
  Init(this,file,line,FATAL,0x10a81c);
  pLVar2 = &this->data_->stream_;
  std::__ostream_insert<char,std::char_traits<char>>(&pLVar2->super_ostream,"Check failed: ",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (&pLVar2->super_ostream,(result->str_->_M_dataplus)._M_p,
                      result->str_->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  return;
}

Assistant:

LogMessage::LogMessage(const char* file, int line, const CheckOpString& result)
    : allocated_(nullptr) {
  Init(file, line, GLOG_FATAL, &LogMessage::SendToLog);
  stream() << "Check failed: " << (*result.str_) << " ";
}